

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_folder.c
# Opt level: O0

int mpt_parse_folder(DIR *cfg,mpt_path_handler_t save,void *ctx,mpt_logger *log)

{
  int iVar1;
  dirent *pdVar2;
  FILE *__stream;
  int line;
  int cfile;
  char buf [1024];
  uint local_8c;
  int cdir;
  int res;
  dirent *dent;
  mpt_parser_format fmt;
  mpt_path p;
  mpt_parser_context src;
  mpt_logger *log_local;
  void *ctx_local;
  mpt_path_handler_t save_local;
  DIR *cfg_local;
  
  p.first = '\0';
  p.flags = '\0';
  p.sep = '\0';
  p.assign = '\0';
  p._28_4_ = 0;
  fmt.oend = '\0';
  fmt.esc[0] = '\0';
  fmt.esc[1] = '\0';
  fmt.esc[2] = '\0';
  fmt.com[0] = '\0';
  fmt.com[1] = '\0';
  fmt.com[2] = '\0';
  fmt.com[3] = '\0';
  p.base = (char *)0x0;
  p.off = 0;
  p.len = 0x2e0000;
  stack0xffffffffffffff84 = 0x2722003d007d7b;
  fmt.sstart = '#';
  fmt.send = '\0';
  fmt.ostart = '\0';
  fmt.assign = '\0';
  local_8c = 0;
  if (save == (mpt_path_handler_t)0x0) {
    cfg_local._4_4_ = 0xffffffff;
  }
  else if (cfg == (DIR *)0x0) {
    cfg_local._4_4_ = 0xfffffff0;
  }
  else {
    iVar1 = dirfd((DIR *)cfg);
    if (iVar1 < 0) {
      cfg_local._4_4_ = 0xffffffff;
    }
    else {
      mpt_parse_format((mpt_parser_format *)((long)&dent + 4),(char *)0x0);
      p._24_8_ = mpt_getchar_stdio;
      while (pdVar2 = readdir((DIR *)cfg), pdVar2 != (dirent *)0x0) {
        if (pdVar2->d_name[0] != '.') {
          iVar1 = dirfd((DIR *)cfg);
          iVar1 = openat(iVar1,pdVar2->d_name,0);
          if (iVar1 < 0) {
            mpt_log(log,"mpt_parse_folder",4,"%s: %s","unable to read file",pdVar2->d_name);
          }
          else {
            p.len._0_3_ = CONCAT12(0,(ushort)p.len);
            mpt_path_set((mpt_path *)&fmt.oend,(char *)&line,-1);
            p.base = (char *)0x0;
            p.off = 0;
            (*save)(ctx,(mpt_path *)&fmt.oend,(mpt_value *)0x0,0,0);
            __stream = fdopen(iVar1,"r");
            if (__stream == (FILE *)0x0) {
              mpt_log(log,"mpt_parse_folder",3,"%s: %s","unable to allocate file",pdVar2->d_name);
              close(iVar1);
            }
            else {
              local_8c = mpt_parse_config(mpt_parse_format_pre,(void *)((long)&dent + 4),
                                          (mpt_parser_context *)&p.first,save,ctx);
              fclose(__stream);
              if (log != (mpt_logger *)0x0) {
                if ((int)local_8c < 0) {
                  mpt_log(log,"mpt_parse_folder",3,"%s: %d (line %d): %s","parse error",
                          (ulong)local_8c,1,pdVar2->d_name);
                }
                else {
                  mpt_log(log,"mpt_parse_folder",0x18,"%s: %s","processed file",pdVar2->d_name);
                }
              }
              if ((int)local_8c < 0) break;
              local_8c = 1;
            }
          }
        }
      }
      cfg_local._4_4_ = local_8c;
    }
  }
  return cfg_local._4_4_;
}

Assistant:

extern int mpt_parse_folder(DIR *cfg, MPT_TYPE(path_handler) save, void *ctx, MPT_INTERFACE(logger) *log)
{
	MPT_STRUCT(parser_context) src = MPT_PARSER_INIT;
	MPT_STRUCT(path) p = MPT_PATH_INIT;
	MPT_STRUCT(parser_format) fmt = MPT_PARSER_FORMAT_INIT;
	struct dirent *dent;
	int res = 0;
	int cdir;
	
	if (!save) {
		return MPT_ERROR(BadArgument);
	}
	if (!cfg) {
		return MPT_ERROR(MissingData);
	}
	if ((cdir = dirfd(cfg)) < 0) {
		return MPT_ERROR(BadArgument);
	}
	/* allow default format override */
	mpt_parse_format(&fmt, 0);
	src.src.getc = (int (*)(void *)) mpt_getchar_stdio;
	
	while ((dent = readdir(cfg))) {
		char buf[1024];
		int cfile;
		
		/* skip current/parent directory and invisible files */
		if (dent->d_name[0] == '.') {
			continue;
		}
		if ((cfile = openat(dirfd(cfg), dent->d_name, O_RDONLY)) < 0) {
			mpt_log(log, __func__, MPT_LOG(Warning), "%s: %s", MPT_tr("unable to read file"), dent->d_name);
			continue;
		}
		p.sep = 0;
		mpt_path_set(&p, buf, -1);
		p.len = p.off = 0;
		
		/* indicate new config file start */
		save(ctx, &p, 0, 0, 0);
		
		if (!(src.src.arg = fdopen(cfile, "r"))) {
			mpt_log(log, __func__, MPT_LOG(Error), "%s: %s", MPT_tr("unable to allocate file"), dent->d_name);
			close(cfile);
			continue;
		}
		src.src.line = 1;
		res = mpt_parse_config((MPT_TYPE(input_parser)) mpt_parse_format_pre, &fmt, &src, save, ctx);
		fclose(src.src.arg);
		if (log) {
			int line = src.src.line;
			if (res < 0) {
				mpt_log(log, __func__, MPT_LOG(Error), "%s: %d (line %d): %s", MPT_tr("parse error"), res, line, dent->d_name);
			} else {
				mpt_log(log, __func__, MPT_LOG(Debug3), "%s: %s", MPT_tr("processed file"), dent->d_name);
			}
		}
		if (res < 0) {
			break;
		}
		res = 1;
	}
	return res;
}